

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  bool bVar1;
  ostream *os_00;
  String *this;
  String *this_00;
  String local_28;
  String *local_18;
  ostream *os_local;
  uchar c_local;
  
  os_00 = (ostream *)(ulong)c;
  local_18 = (String *)os;
  os_local._3_1_ = c;
  switch(os_00) {
  case (ostream *)0x0:
    std::operator<<(os,"\\0");
    break;
  default:
    bVar1 = IsPrintableAscii((uint)c);
    if (!bVar1) {
      this_00 = &local_28;
      this = local_18;
      String::Format(this_00,"\\x%X",(ulong)os_local._3_1_);
      operator<<(os_00,this_00);
      String::~String(this);
      return kHexEscape;
    }
    std::operator<<((ostream *)local_18,os_local._3_1_);
    return kAsIs;
  case (ostream *)0x7:
    std::operator<<(os,"\\a");
    break;
  case (ostream *)0x8:
    std::operator<<(os,"\\b");
    break;
  case (ostream *)0x9:
    std::operator<<(os,"\\t");
    break;
  case (ostream *)0xa:
    std::operator<<(os,"\\n");
    break;
  case (ostream *)0xb:
    std::operator<<(os,"\\v");
    break;
  case (ostream *)0xc:
    std::operator<<(os,"\\f");
    break;
  case (ostream *)0xd:
    std::operator<<(os,"\\r");
    break;
  case (ostream *)0x27:
    std::operator<<(os,"\\\'");
    break;
  case (ostream *)0x5c:
    std::operator<<(os,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << String::Format("\\x%X", static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}